

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O2

bool __thiscall
Centaurus::CompositeATN<char>::verify_decisions
          (CompositeATN<char> *this,
          unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
          *network)

{
  _Hash_node_base *p_Var1;
  long lVar2;
  long lVar3;
  __node_base *local_a8;
  ATNPath local_90;
  ATNPath local_70;
  NFABase<Centaurus::LDFAState<char>_> local_50;
  
  local_a8 = &(network->_M_h)._M_before_begin;
  while (local_a8 = local_a8->_M_nxt, local_a8 != (__node_base *)0x0) {
    lVar3 = 0x10;
    for (lVar2 = 0; p_Var1 = local_a8[7]._M_nxt,
        lVar2 < (int)(((long)local_a8[8]._M_nxt - (long)p_Var1) / 0x98); lVar2 = lVar2 + 1) {
      if (1 < (int)((*(long *)((long)&p_Var1->_M_nxt + lVar3) -
                    *(long *)((long)&p_Var1[-1]._M_nxt + lVar3)) / 0x18)) {
        ATNPath::ATNPath(&local_70,(Identifier *)(local_a8 + 1),(int)lVar2);
        convert_atn_path(&local_90,this,&local_70);
        LookaheadDFA<char>::LookaheadDFA((LookaheadDFA<char> *)&local_50,this,&local_90,true);
        NFABase<Centaurus::LDFAState<char>_>::~NFABase(&local_50);
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector(&local_90.
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
        std::
        vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
        ::~vector(&local_70.
                   super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                 );
      }
      lVar3 = lVar3 + 0x98;
    }
  }
  return true;
}

Assistant:

bool CompositeATN<TCHAR>::verify_decisions(const std::unordered_map<Identifier, ATNMachine<TCHAR> >& network) const
{
    for (const auto& p : network)
    {
        for (int i = 0; i < p.second.get_node_num(); i++)
        {
            int outbound_num = p.second.get_node(i).get_transitions().size();

            if (outbound_num > 1)
            {
                try
                {
                    LookaheadDFA<TCHAR>(*this, convert_atn_path(ATNPath(p.first, i)));
                }
                catch (...)
                {
                    std::wcerr << L"Decision check failed at " << ATNPath(p.first, i) << std::endl;
                    return false;
                }
            }
        }
    }
    return true;
}